

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

void __thiscall
cpptrace::stacktrace::print_with_snippets
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  reference psVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *path;
  uint *puVar7;
  char *local_a0;
  string local_78;
  reference local_58;
  stacktrace_frame *frame;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range1;
  size_t sStack_30;
  uint frame_number_width;
  size_t counter;
  char *header_local;
  bool newline_at_end_local;
  bool color_local;
  ostream *stream_local;
  stacktrace *this_local;
  
  if ((color) &&
     (((stream == (ostream *)&std::cout && (uVar3 = isatty(stdout_fileno), (uVar3 & 1) != 0)) ||
      ((stream == (ostream *)&std::cerr && (uVar3 = isatty(stderr_fileno), (uVar3 & 1) != 0)))))) {
    cpptrace::detail::enable_virtual_terminal_processing_if_needed();
  }
  local_a0 = header;
  if (header == (char *)0x0) {
    local_a0 = "Stack trace (most recent call first):";
  }
  poVar4 = std::operator<<(stream,local_a0);
  uVar3 = 10;
  std::operator<<(poVar4,'\n');
  sStack_30 = 0;
  bVar2 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
          empty(&this->frames);
  if (bVar2) {
    poVar4 = std::operator<<(stream,"<empty trace>");
    std::operator<<(poVar4,'\n');
  }
  else {
    sVar5 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
            size(&this->frames);
    uVar3 = cpptrace::detail::n_digits((detail *)(ulong)((int)sVar5 - 1),uVar3);
    __end1 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
             begin(&this->frames);
    frame = (stacktrace_frame *)
            std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
            end(&this->frames);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                                       *)&frame), bVar2) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                 ::operator*(&__end1);
      print_frame(stream,color,uVar3,sStack_30,local_58);
      psVar1 = local_58;
      if ((newline_at_end) ||
         (pvVar6 = std::
                   vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
                   back(&this->frames), psVar1 != pvVar6)) {
        std::operator<<(stream,'\n');
      }
      bVar2 = nullable<unsigned_int,_0>::has_value(&local_58->line);
      if ((bVar2) &&
         (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty(&local_58->filename), !bVar2)) {
        path = &local_58->filename;
        puVar7 = nullable<unsigned_int,_0>::value(&local_58->line);
        cpptrace::detail::get_snippet(&local_78,path,(ulong)*puVar7,2,color);
        std::operator<<(stream,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      sStack_30 = sStack_30 + 1;
      __gnu_cxx::
      __normal_iterator<const_cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void stacktrace::print_with_snippets(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>" << '\n';
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            if(frame.line.has_value() && !frame.filename.empty()) {
                stream << detail::get_snippet(frame.filename, frame.line.value(), 2, color);
            }
            counter++;
        }
    }